

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O1

void __thiscall wasm::Fatal::~Fatal(Fatal *this)

{
  ostream *poVar1;
  undefined8 extraout_RAX;
  char *local_30;
  long local_28;
  
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_30,local_28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&local_30);
  _Exit(1);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

[[noreturn]] ~Fatal() {
    std::cerr << buffer.str() << std::endl;
    // Use _Exit here to avoid calling static destructors. This avoids deadlocks
    // in (for example) the thread worker pool, where workers hold a lock while
    // performing their work.
    _Exit(EXIT_FAILURE);
  }